

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

LocaleHash __thiscall QMimeXMLProvider::localeComments(QMimeXMLProvider *this,QString *name)

{
  QString *in_RDX;
  QHash<QString,_QMimeTypeXMLData> *in_RSI;
  QMimeTypeXMLData *in_RDI;
  long in_FS_OFFSET;
  QMimeTypeXMLData *this_00;
  QHash<QString,_QString> *other;
  QHash<QString,_QString> local_78 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  other = local_78;
  this_00 = in_RDI;
  QHash<QString,_QMimeTypeXMLData>::value(in_RSI,in_RDX);
  QHash<QString,_QString>::QHash((QHash<QString,_QString> *)in_RDX,other);
  QMimeTypeXMLData::~QMimeTypeXMLData(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (LocaleHash)(Data *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QMimeTypePrivate::LocaleHash QMimeXMLProvider::localeComments(const QString &name)
{
    return m_nameMimeTypeMap.value(name).localeComments;
}